

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmFBcc<(moira::Instr)188,(moira::Mode)12,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  
  uVar6 = *addr + 2;
  *addr = uVar6;
  iVar3 = (*this->_vptr_Moira[6])(this,(ulong)uVar6);
  *addr = *addr + 2;
  uVar4 = (*this->_vptr_Moira[6])(this);
  uVar4 = uVar4 & 0xffff | iVar3 << 0x10;
  if (((op & 0x7f) == 0) && (uVar4 == 0)) {
    cVar2 = 'f';
    lVar5 = 0;
    do {
      pcVar1 = str->ptr;
      str->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "fnop"[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar1 = str->ptr;
      str->ptr = pcVar1 + 1;
      *pcVar1 = ' ';
    }
    return;
  }
  cVar2 = 'f';
  lVar5 = 0;
  do {
    pcVar1 = str->ptr;
    str->ptr = pcVar1 + 1;
    *pcVar1 = cVar2;
    cVar2 = "sfb"[lVar5 + 2];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 2);
  StrWriter::operator<<(str,(Fcc)(op & 0x1f));
  if (str->style->syntax - MOIRA_MIT < 3) {
    pcVar1 = str->ptr;
    str->ptr = pcVar1 + 1;
    *pcVar1 = 'l';
  }
  else {
    cVar2 = '.';
    lVar5 = 0;
    do {
      pcVar1 = str->ptr;
      str->ptr = pcVar1 + 1;
      *pcVar1 = cVar2;
      cVar2 = "$%x.l"[lVar5 + 4];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 2);
  }
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar1 = str->ptr;
    str->ptr = pcVar1 + 1;
    *pcVar1 = ' ';
  }
  else {
    iVar3 = (str->tab).raw;
    do {
      pcVar1 = str->ptr;
      str->ptr = pcVar1 + 1;
      *pcVar1 = ' ';
    } while (str->ptr < str->base + iVar3);
  }
  StrWriter::operator<<(str,(UInt)(uVar4 + uVar6));
  return;
}

Assistant:

void
Moira::dasmFBcc(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead<S>(addr);
    auto cnd = ___________xxxxx (op);

    // Check for special FNOP opcode
    if ((op & 0x7F) == 0 && ext == 0) {

        dasmFNop<Instr::FNOP, M, S>(str, addr, op);
        return;
    }

    auto dst = old + 2;
    U32_INC(dst, SEXT<S>(ext));

    if (S == Long) {
        str << Ins<I>{} << Fcc{cnd} << Sz<S>{} << str.tab << UInt(dst);
    } else {
        str << Ins<I>{} << Fcc{cnd} << str.tab << UInt(dst);
    }
}